

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

void aux_lines(lua_State *L,int toclose)

{
  int iVar1;
  int iVar2;
  int local_18;
  int n;
  int i;
  int toclose_local;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  iVar2 = iVar1 + -1;
  if (0x11 < iVar2) {
    luaL_argerror(L,0x11,"too many options");
  }
  lua_pushvalue(L,1);
  lua_pushinteger(L,(long)iVar2);
  lua_pushboolean(L,toclose);
  for (local_18 = 1; local_18 <= iVar2; local_18 = local_18 + 1) {
    lua_pushvalue(L,local_18 + 1);
  }
  lua_pushcclosure(L,io_readline,iVar1 + 2);
  return;
}

Assistant:

static void aux_lines (lua_State *L, int toclose) {
  int i;
  int n = lua_gettop(L) - 1;  /* number of arguments to read */
  /* ensure that arguments will fit here and into 'io_readline' stack */
  luaL_argcheck(L, n <= LUA_MINSTACK - 3, LUA_MINSTACK - 3, "too many options");
  lua_pushvalue(L, 1);  /* file handle */
  lua_pushinteger(L, n);  /* number of arguments to read */
  lua_pushboolean(L, toclose);  /* close/not close file when finished */
  for (i = 1; i <= n; i++) lua_pushvalue(L, i + 1);  /* copy arguments */
  lua_pushcclosure(L, io_readline, 3 + n);
}